

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::OnAssertTrapCommand(CommandRunner *this,AssertTrapCommand *command)

{
  uint32_t line_number;
  undefined8 local_90 [4];
  ActionResult result;
  
  RunAction(&result,this,(command->super_CommandMixin<(wabt::CommandType)8>).super_Command.line,
            &command->action,Quiet);
  line_number = (command->super_CommandMixin<(wabt::CommandType)8>).super_Command.line;
  if (result.trap.obj_ == (Trap *)0x0) {
    PrintError(this,line_number,"expected trap: \"%s\"",(command->text)._M_dataplus._M_p);
  }
  else {
    std::__cxx11::string::string((string *)local_90,(string *)&(result.trap.obj_)->message_);
    PrintError(this,line_number,"assert_trap passed: %s",local_90[0]);
    std::__cxx11::string::_M_dispose();
  }
  ActionResult::~ActionResult(&result);
  return (Result)(uint)(result.trap.obj_ == (Trap *)0x0);
}

Assistant:

wabt::Result CommandRunner::OnAssertTrapCommand(
    const AssertTrapCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);
  if (!result.trap) {
    PrintError(command->line, "expected trap: \"%s\"", command->text.c_str());
    return wabt::Result::Error;
  }

  PrintError(command->line, "assert_trap passed: %s",
             result.trap->message().c_str());
  return wabt::Result::Ok;
}